

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O0

void embree::addCollisionConstraints(RTCScene scene)

{
  type pMVar1;
  bool bVar2;
  reference ppVar3;
  reference pvVar4;
  reference pvVar5;
  vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_> *in_RDI;
  uint in_stack_0000000c;
  uint in_stack_00000010;
  uint in_stack_00000014;
  RTCScene in_stack_00000018;
  CollisionConstraint *c_2;
  CollisionConstraint *c_1;
  CollisionConstraint *c;
  pair<unsigned_int,_unsigned_int> *c1;
  pair<unsigned_int,_unsigned_int> *c0;
  pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_> *coll;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *__range1;
  ClothModel *cloth;
  vector<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *in_stack_ffffffffffffff58;
  vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
  *in_stack_ffffffffffffff60;
  ClothModel *in_stack_ffffffffffffff80;
  __normal_iterator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_*,_std::vector<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_20;
  undefined1 *local_18;
  type local_10;
  vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_> *local_8;
  
  local_8 = in_RDI;
  std::
  vector<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>,_std::allocator<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>_>_>
  ::operator[]((vector<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>,_std::allocator<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>_>_>
                *)meshes,(ulong)clothID);
  local_10 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::
             operator*((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                        *)in_stack_ffffffffffffff60);
  collide2::ClothModel::clearCollisionConstraints(in_stack_ffffffffffffff80);
  local_18 = sim_collisions;
  local_20._M_current =
       (pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_> *)
       std::
       vector<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
       ::begin(in_stack_ffffffffffffff58);
  std::
  vector<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  ::end(in_stack_ffffffffffffff58);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_*,_std::vector<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                             *)in_stack_ffffffffffffff60,
                            (__normal_iterator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_*,_std::vector<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                             *)in_stack_ffffffffffffff58), bVar2) {
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_*,_std::vector<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ::operator*(&local_20);
    if (((clothID != (ppVar3->first).first) || (clothID != (ppVar3->second).first)) &&
       (clothID == (ppVar3->second).first)) {
      pMVar1 = local_10 + 3;
      pvVar4 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                         (&local_10->tris_,(ulong)(ppVar3->second).second);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&pMVar1->tris_,(long)pvVar4->v0);
      if ((*pvVar5 != 0.0) || (NAN(*pvVar5))) {
        std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                  (&local_10->tris_,(ulong)(ppVar3->second).second);
        makeCollisionConstraint
                  (in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c);
        std::vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
        ::push_back(in_stack_ffffffffffffff60,(value_type *)in_stack_ffffffffffffff58);
      }
      pMVar1 = local_10 + 3;
      pvVar4 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                         (&local_10->tris_,(ulong)(ppVar3->second).second);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&pMVar1->tris_,(long)pvVar4->v1);
      if ((*pvVar5 != 0.0) || (NAN(*pvVar5))) {
        std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                  (&local_10->tris_,(ulong)(ppVar3->second).second);
        makeCollisionConstraint
                  (in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c);
        std::vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
        ::push_back(in_stack_ffffffffffffff60,(value_type *)in_stack_ffffffffffffff58);
      }
      pMVar1 = local_10 + 3;
      pvVar4 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                         (&local_10->tris_,(ulong)(ppVar3->second).second);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&pMVar1->tris_,(long)pvVar4->v2);
      if ((*pvVar5 != 0.0) || (NAN(*pvVar5))) {
        in_stack_ffffffffffffff60 = local_8;
        std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                  (&local_10->tris_,(ulong)(ppVar3->second).second);
        makeCollisionConstraint
                  (in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c);
        std::vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
        ::push_back(in_stack_ffffffffffffff60,(value_type *)in_stack_ffffffffffffff58);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_*,_std::vector<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void addCollisionConstraints (RTCScene scene)
{
  auto & cloth = (collide2::ClothModel &) (*meshes[clothID]);
  cloth.clearCollisionConstraints();
  
  for (auto const & coll : sim_collisions) {
    auto & c0 = coll.first;
    auto & c1 = coll.second;

    // throw out self collisions for now
    if (clothID == c0.first && clothID == c1.first) continue;

    // push back cloth vertex constraints if not fixed
    if (clothID == c1.first) {
      if (cloth.m_inv_[cloth.tris_[c1.second].v0] != 0) {
        auto c = makeCollisionConstraint (scene, cloth.tris_[c1.second].v0, c0.first, c0.second);
        cloth.c_constraints_.push_back (c);
      }
      if (cloth.m_inv_[cloth.tris_[c1.second].v1] != 0) {
        auto c = makeCollisionConstraint (scene, cloth.tris_[c1.second].v1, c0.first, c0.second);
        cloth.c_constraints_.push_back (c);
      }
      if (cloth.m_inv_[cloth.tris_[c1.second].v2] != 0) {
        auto c = makeCollisionConstraint (scene, cloth.tris_[c1.second].v2, c0.first, c0.second);
        cloth.c_constraints_.push_back (c);
      }
    }
  }
}